

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

void __thiscall
Js::SegmentBTree::SwapSegment
          (SegmentBTree *this,uint32 originalKey,SparseArraySegmentBase *oldSeg,
          SparseArraySegmentBase *newSeg)

{
  SparseArraySegmentBase *pSVar1;
  SparseArraySegmentBase **ppSVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  undefined4 *puVar6;
  uint *puVar7;
  SegmentBTree *pSVar8;
  ulong uVar9;
  ulong uVar10;
  uint32 itemIndex;
  
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  do {
    uVar10 = 0;
    if (this->segmentCount != 0) {
      puVar7 = (this->keys).ptr;
      uVar9 = 0;
      do {
        uVar5 = puVar7[uVar9];
        pSVar1 = (this->segments).ptr[uVar9];
        if ((uVar5 != pSVar1->left) && (pSVar1 != newSeg || oldSeg != newSeg)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar6 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                      ,0xd7,
                                      "(keys[i] == segments[i]->left || (oldSeg == newSeg && newSeg == segments[i]))"
                                      ,
                                      "keys[i] == segments[i]->left || (oldSeg == newSeg && newSeg == segments[i])"
                                     );
          if (!bVar4) goto LAB_00b69c5b;
          *puVar6 = 0;
          puVar7 = (this->keys).ptr;
          uVar5 = puVar7[uVar9];
        }
        if (originalKey < uVar5) {
          uVar10 = 0;
          if ((int)uVar9 == 0) goto LAB_00b69bd9;
          break;
        }
        uVar9 = uVar9 + 1;
      } while ((uint)uVar9 < this->segmentCount);
      uVar10 = uVar9 & 0xffffffff;
      ppSVar2 = (this->segments).ptr;
      uVar5 = (int)uVar9 - 1;
      if (ppSVar2[uVar5] == oldSeg) {
        ppSVar2[uVar5] = newSeg;
        (this->keys).ptr[uVar5] = newSeg->left;
        return;
      }
    }
LAB_00b69bd9:
    pSVar8 = (this->children).ptr;
    if (pSVar8 == (SegmentBTree *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0xea,"(!IsLeaf())","!IsLeaf()");
      if (!bVar4) {
LAB_00b69c5b:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar6 = 0;
      pSVar8 = (this->children).ptr;
    }
    this = pSVar8 + uVar10;
  } while( true );
}

Assistant:

void SegmentBTree::SwapSegment(uint32 originalKey, SparseArraySegmentBase* oldSeg, SparseArraySegmentBase* newSeg)
    {
        // Find old segment
        uint32 itemIndex = originalKey;
        uint32 i = 0;

        for(; i < segmentCount; i++)
        {
            Assert(keys[i] == segments[i]->left || (oldSeg == newSeg && newSeg == segments[i]));
            if (itemIndex <  keys[i])
            {
                break;
            }
        }

        // i is 1 past any match

        if (i > 0)
        {
            if (oldSeg == segments[i-1])
            {
                segments[i-1] = newSeg;
                keys[i-1] = newSeg->left;
                return;
            }
        }

        Assert(!IsLeaf());
        children[i].SwapSegment(originalKey, oldSeg, newSeg);
    }